

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.hpp
# Opt level: O1

result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
* __thiscall
toml::detail::parse_offset_datetime_abi_cxx11_
          (result<std::pair<toml::offset_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
           *__return_storage_ptr__,detail *this,location *loc)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  size_type *psVar2;
  local_date lVar3;
  uint uVar4;
  uint uVar5;
  undefined8 uVar6;
  undefined8 uVar7;
  undefined8 uVar8;
  uint uVar9;
  uint uVar10;
  value_type *pvVar11;
  value_type *pvVar12;
  syntax_error *this_00;
  internal_error *piVar13;
  __normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_> in_RCX;
  const_iterator cVar14;
  location *extraout_RDX;
  location *extraout_RDX_00;
  location *extraout_RDX_01;
  location *loc_00;
  ushort uVar15;
  EVP_PKEY_CTX *ctx;
  ushort uVar16;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_00;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_01;
  initializer_list<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  __l_02;
  string str;
  result<toml::detail::region,_toml::detail::none_t> ofs;
  location inner_loc;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  datetime;
  result<toml::detail::region,_toml::detail::none_t> token;
  allocator_type local_349;
  string local_348;
  undefined1 local_328 [32];
  undefined1 local_308 [16];
  undefined1 local_2f8 [40];
  undefined1 local_2d0 [24];
  const_iterator cStack_2b8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_2a8;
  undefined1 local_298 [40];
  undefined1 local_270 [80];
  undefined8 local_220;
  undefined1 auStack_218 [8];
  undefined1 local_210 [40];
  undefined1 local_1e8 [24];
  const_iterator cStack_1d0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_1c8;
  location local_1b0;
  string local_168;
  undefined1 local_148 [80];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_f8;
  result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_d8;
  result<toml::detail::region,_toml::detail::none_t> local_78;
  
  cVar14._M_current = *(char **)(this + 0x40);
  sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<4UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<'-'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>,_toml::detail::either<toml::detail::character<'T'>,_toml::detail::character<'t'>,_toml::detail::character<'_'>_>,_toml::detail::sequence<toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::maybe<toml::detail::sequence<toml::detail::character<'.'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::at_least<1UL>_>_>_>_>,_toml::detail::either<toml::detail::character<'Z'>,_toml::detail::character<'z'>,_toml::detail::sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>_>_>_>
  ::invoke(&local_78,(location *)this);
  if (local_78.is_ok_ == true) {
    local_168._M_dataplus._M_p = (pointer)&local_168.field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_168,*(long *)(this + 0x20),
               *(long *)(this + 0x28) + *(long *)(this + 0x20));
    pvVar11 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
              ((string *)local_308,(detail *)(pvVar11->first_)._M_current,
               (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
               (pvVar11->last_)._M_current,in_RCX);
    location::location(&local_1b0,&local_168,(string *)local_308);
    loc_00 = extraout_RDX;
    if ((undefined1 *)local_308._0_8_ != local_2f8) {
      operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
      loc_00 = extraout_RDX_00;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_168._M_dataplus._M_p != &local_168.field_2) {
      operator_delete(local_168._M_dataplus._M_p,local_168.field_2._M_allocated_capacity + 1);
      loc_00 = extraout_RDX_01;
    }
    parse_local_datetime_abi_cxx11_(&local_d8,(detail *)&local_1b0,loc_00);
    if ((local_d8.is_ok_ != true) ||
       (local_1b0.iter_._M_current ==
        ((local_1b0.source_.
          super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr)->super__Vector_base<char,_std::allocator<char>_>)._M_impl.super__Vector_impl_data.
        _M_finish)) {
      piVar13 = (internal_error *)__cxa_allocate_exception(0x78);
      local_348._M_dataplus._M_p = (pointer)&local_348.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_348,"toml::parse_offset_datetime: invalid datetime format","");
      source_location::source_location((source_location *)&local_220,&local_1b0);
      std::
      pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::pair<toml::source_location,_const_char_(&)[19],_true>
                ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_308,(source_location *)&local_220,(char (*) [19])"date, not datetime");
      __l_00._M_len = 1;
      __l_00._M_array = (iterator)local_308;
      std::
      vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                *)local_328,__l_00,(allocator_type *)&local_1c8);
      local_298._0_8_ = (pointer)0x0;
      local_298._8_8_ = (pointer)0x0;
      local_298._16_8_ = (pointer)0x0;
      format_underline((string *)local_148,&local_348,
                       (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                        *)local_328,
                       (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_298,false);
      source_location::source_location((source_location *)local_270,&local_1b0);
      internal_error::internal_error(piVar13,(string *)local_148,(source_location *)local_270);
      __cxa_throw(piVar13,&internal_error::typeinfo,internal_error::~internal_error);
    }
    cVar14._M_current = local_1b0.iter_._M_current;
    sequence<toml::detail::either<toml::detail::character<'+'>,_toml::detail::character<'-'>_>,_toml::detail::sequence<toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>,_toml::detail::character<':'>,_toml::detail::repeat<toml::detail::in_range<'0',_'9'>,_toml::detail::exactly<2UL>_>_>_>
    ::invoke((result<toml::detail::region,_toml::detail::none_t> *)&local_220,&local_1b0);
    if (local_220._0_1_ == true) {
      pvVar11 = result<toml::detail::region,_toml::detail::none_t>::unwrap
                          ((result<toml::detail::region,_toml::detail::none_t> *)&local_220);
      make_string<__gnu_cxx::__normal_iterator<char_const*,std::vector<char,std::allocator<char>>>>
                (&local_348,(detail *)(pvVar11->first_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 (pvVar11->last_)._M_current,
                 (__normal_iterator<const_char_*,_std::vector<char,_std::allocator<char>_>_>)
                 cVar14._M_current);
      std::__cxx11::string::substr((ulong)local_308,(ulong)&local_348);
      uVar9 = from_string<int>((string *)local_308,0);
      if ((undefined1 *)local_308._0_8_ != local_2f8) {
        operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
      }
      std::__cxx11::string::substr((ulong)local_308,(ulong)&local_348);
      uVar10 = from_string<int>((string *)local_308,0);
      if ((undefined1 *)local_308._0_8_ != local_2f8) {
        operator_delete((void *)local_308._0_8_,local_2f8._0_8_ + 1);
      }
      if ((0x17 < uVar9) || (0x3b < uVar10)) {
        this_00 = (syntax_error *)__cxa_allocate_exception(0x78);
        local_298._0_8_ = local_298 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_298,
                   "toml::parse_offset_datetime: invalid offset: it does not conform RFC3339.","");
        source_location::source_location((source_location *)local_270,(location *)this);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[78],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_308,(source_location *)local_270,
                   (char (*) [78])
                   "month should be 01-12, day should be 01-28,29,30,31, depending on month/year.");
        __l_01._M_len = 1;
        __l_01._M_array = (iterator)local_308;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)&local_1c8,__l_01,&local_349);
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_f8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline((string *)local_328,(string *)local_298,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)&local_1c8,&local_f8,false);
        source_location::source_location((source_location *)local_148,&local_1b0);
        syntax_error::syntax_error(this_00,(string *)local_328,(source_location *)local_148);
        __cxa_throw(this_00,&syntax_error::typeinfo,syntax_error::~syntax_error);
      }
      uVar4 = -uVar10;
      uVar5 = -uVar9;
      if (*local_348._M_dataplus._M_p == '+') {
        uVar4 = uVar10;
        uVar5 = uVar9;
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_348._M_dataplus._M_p != &local_348.field_2) {
        operator_delete(local_348._M_dataplus._M_p,local_348.field_2._M_allocated_capacity + 1);
      }
      uVar16 = (ushort)(uVar4 << 8);
      uVar15 = (ushort)uVar5 & 0xff;
    }
    else {
      if ((byte)(*local_1b0.iter_._M_current | 0x20U) != 0x7a) {
        piVar13 = (internal_error *)__cxa_allocate_exception(0x78);
        local_328._0_8_ = local_328 + 0x10;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_328,"toml::parse_offset_datetime: invalid datetime format","");
        source_location::source_location((source_location *)local_270,&local_1b0);
        std::
        pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::pair<toml::source_location,_const_char_(&)[26],_true>
                  ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)local_308,(source_location *)local_270,
                   (char (*) [26])"should be `Z` or `+HH:MM`");
        __l_02._M_len = 1;
        __l_02._M_array = (iterator)local_308;
        std::
        vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  *)local_298,__l_02,(allocator_type *)&local_f8);
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
        local_1c8.
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
        format_underline(&local_348,(string *)local_328,
                         (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                          *)local_298,&local_1c8,false);
        source_location::source_location((source_location *)local_148,&local_1b0);
        internal_error::internal_error(piVar13,&local_348,(source_location *)local_148);
        __cxa_throw(piVar13,&internal_error::typeinfo,internal_error::~internal_error);
      }
      uVar15 = 0;
      uVar16 = 0;
    }
    if (local_220._0_1_ == true) {
      region::~region((region *)auStack_218);
    }
    pvVar12 = result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              ::unwrap(&local_d8);
    lVar3 = (pvVar12->first).date;
    local_270._8_2_ = (pvVar12->first).time.nanosecond;
    local_270._0_8_ = *(undefined8 *)&(pvVar12->first).time;
    pvVar11 = result<toml::detail::region,_toml::detail::none_t>::unwrap(&local_78);
    auStack_218._6_2_ = uVar15 | uVar16;
    local_220._4_4_ = (uint_least32_t)local_270._0_8_;
    auStack_218._0_4_ = SUB84(local_270._0_8_,4);
    auStack_218._4_2_ = local_270._8_2_;
    local_220._0_4_ = lVar3;
    region::region((region *)local_210,pvVar11);
    uVar8 = local_210._32_8_;
    uVar7 = local_210._16_8_;
    uVar6 = local_210._8_8_;
    local_308._0_8_ = CONCAT44(local_220._4_4_,local_220._0_4_);
    local_308._8_8_ = CONCAT26(auStack_218._6_2_,CONCAT24(auStack_218._4_2_,auStack_218._0_4_));
    local_2f8._0_8_ = &PTR__region_001a7798;
    local_210._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_210._16_8_ = (pointer)0x0;
    if ((EVP_PKEY_CTX *)local_210._24_8_ == (EVP_PKEY_CTX *)local_1e8) {
      local_2d0._8_8_ = local_1e8._8_8_;
      local_2f8._24_8_ = (EVP_PKEY_CTX *)local_2d0;
    }
    else {
      local_2f8._24_8_ = local_210._24_8_;
    }
    local_2d0._1_7_ = local_1e8._1_7_;
    local_2d0[0] = local_1e8[0];
    local_210._32_8_ = 0;
    local_1e8[0] = '\0';
    local_2d0._16_8_ = local_1e8._16_8_;
    cStack_2b8._M_current = cStack_1d0._M_current;
    __return_storage_ptr__->is_ok_ = true;
    (__return_storage_ptr__->field_1).fail.value._M_dataplus._M_p =
         (pointer)CONCAT44(local_220._4_4_,local_220._0_4_);
    (__return_storage_ptr__->field_1).fail.value._M_string_length =
         CONCAT26(auStack_218._6_2_,CONCAT24(auStack_218._4_2_,auStack_218._0_4_));
    (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity =
         (size_type)&PTR__region_001a7798;
    ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
    ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar6;
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x20) = 0;
    local_2f8._16_8_ = 0;
    (__return_storage_ptr__->field_1).succ.value.second.source_.
    super___shared_ptr<const_std::vector<char,_std::allocator<char>_>,_(__gnu_cxx::_Lock_policy)2>.
    _M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar7;
    local_2f8._8_8_ = 0;
    psVar2 = (size_type *)((long)&__return_storage_ptr__->field_1 + 0x38);
    *(size_type **)((long)&__return_storage_ptr__->field_1 + 0x28) = psVar2;
    if ((EVP_PKEY_CTX *)local_2f8._24_8_ == (EVP_PKEY_CTX *)local_2d0) {
      *psVar2 = local_2d0._0_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x40) = local_2d0._8_8_;
    }
    else {
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x28) = local_2f8._24_8_;
      *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x38) = local_2d0._0_8_;
    }
    *(undefined8 *)((long)&__return_storage_ptr__->field_1 + 0x30) = uVar8;
    local_2f8._32_8_ = (pointer)0x0;
    local_2d0._0_8_ = (ulong)(uint7)local_1e8._1_7_ << 8;
    (__return_storage_ptr__->field_1).succ.value.second.first_._M_current = (char *)local_1e8._16_8_
    ;
    *(char **)((long)&__return_storage_ptr__->field_1 + 0x50) = cStack_1d0._M_current;
    ctx = (EVP_PKEY_CTX *)local_2f8._24_8_;
    local_2f8._24_8_ = (EVP_PKEY_CTX *)local_2d0;
    local_210._24_8_ = (EVP_PKEY_CTX *)local_1e8;
    region::~region((region *)local_2f8);
    region::~region((region *)local_210);
    result<std::pair<toml::local_datetime,_toml::detail::region>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::cleanup(&local_d8,ctx);
    location::~location(&local_1b0);
  }
  else {
    location::reset((location *)this,cVar14);
    local_148._0_8_ = local_148 + 0x10;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_148,"toml::parse_offset_datetime: ","");
    source_location::source_location((source_location *)&local_d8,(location *)this);
    std::
    pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::pair<toml::source_location,_const_char_(&)[40],_true>
              ((pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_308,(source_location *)&local_d8,
               (char (*) [40])"the next token is not a offset_datetime");
    __l._M_len = 1;
    __l._M_array = (iterator)local_308;
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              *)&local_1b0,__l,(allocator_type *)local_328);
    local_348._M_dataplus._M_p = (char *)0x0;
    local_348._M_string_length = 0;
    local_348.field_2._M_allocated_capacity = 0;
    format_underline((string *)local_270,(string *)local_148,
                     (vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                      *)&local_1b0,
                     (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)&local_348,false);
    local_220 = local_210;
    if ((undefined1 *)local_270._0_8_ == local_270 + 0x10) {
      local_210._8_8_ = local_270._24_8_;
      local_270._0_8_ = local_220;
    }
    local_210._1_7_ = local_270._17_7_;
    local_210[0] = local_270[0x10];
    __return_storage_ptr__->is_ok_ = false;
    paVar1 = &(__return_storage_ptr__->field_1).fail.value.field_2;
    *(anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
      **)&__return_storage_ptr__->field_1 = paVar1;
    if ((pointer)local_270._0_8_ == local_220) {
      paVar1->_M_allocated_capacity = local_210._0_8_;
      ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
      ((long)&(__return_storage_ptr__->field_1).fail.value.field_2 + 8))->_M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_210._8_8_;
    }
    else {
      *(undefined8 *)&__return_storage_ptr__->field_1 = local_270._0_8_;
      (__return_storage_ptr__->field_1).fail.value.field_2._M_allocated_capacity = local_210._0_8_;
    }
    (__return_storage_ptr__->field_1).fail.value._M_string_length = local_270._8_8_;
    local_210._0_8_ = (ulong)(uint7)local_270._17_7_ << 8;
    auStack_218._6_2_ = 0;
    auStack_218._4_2_ = 0;
    auStack_218._0_4_ = 0;
    local_270[0x10] = '\0';
    local_270._8_8_ = 0;
    local_270._0_8_ = local_270 + 0x10;
    std::
    vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)&local_348);
    std::
    vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::~vector((vector<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<toml::source_location,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
               *)&local_1b0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)cStack_2b8._M_current != &local_2a8) {
      operator_delete(cStack_2b8._M_current,local_2a8._M_allocated_capacity + 1);
    }
    source_location::~source_location((source_location *)local_308);
    source_location::~source_location((source_location *)&local_d8);
    if ((undefined1 *)local_148._0_8_ != local_148 + 0x10) {
      operator_delete((void *)local_148._0_8_,local_148._16_8_ + 1);
    }
  }
  if (local_78.is_ok_ == true) {
    region::~region(&local_78.field_1.succ.value);
  }
  return __return_storage_ptr__;
}

Assistant:

inline result<std::pair<offset_datetime, region>, std::string>
parse_offset_datetime(location& loc)
{
    const auto first = loc.iter();
    if(const auto token = lex_offset_date_time::invoke(loc))
    {
        location inner_loc(loc.name(), token.unwrap().str());
        const auto datetime = parse_local_datetime(inner_loc);
        if(!datetime || inner_loc.iter() == inner_loc.end())
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "date, not datetime"}}),
                source_location(inner_loc));
        }
        time_offset offset(0, 0);
        if(const auto ofs = lex_time_numoffset::invoke(inner_loc))
        {
            const auto str = ofs.unwrap().str();

            const auto hour   = from_string<int>(str.substr(1,2), 0);
            const auto minute = from_string<int>(str.substr(4,2), 0);

            if((hour < 0 || 23 < hour) || (minute < 0 || 59 < minute))
            {
                throw syntax_error(format_underline("toml::parse_offset_datetime: "
                    "invalid offset: it does not conform RFC3339.", {{
                    source_location(loc), "month should be 01-12, day should be"
                    " 01-28,29,30,31, depending on month/year."
                    }}), source_location(inner_loc));
            }

            if(str.front() == '+')
            {
                offset = time_offset(hour, minute);
            }
            else
            {
                offset = time_offset(-hour, -minute);
            }
        }
        else if(*inner_loc.iter() != 'Z' && *inner_loc.iter() != 'z')
        {
            throw internal_error(format_underline(
                "toml::parse_offset_datetime: invalid datetime format",
                {{source_location(inner_loc), "should be `Z` or `+HH:MM`"}}),
                source_location(inner_loc));
        }
        return ok(std::make_pair(offset_datetime(datetime.unwrap().first, offset),
                                 token.unwrap()));
    }
    else
    {
        loc.reset(first);
        return err(format_underline("toml::parse_offset_datetime: ",
            {{source_location(loc), "the next token is not a offset_datetime"}}));
    }
}